

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__png_info_raw(stbi__png *p,int *x,int *y,int *comp)

{
  int iVar1;
  int *comp_local;
  int *y_local;
  int *x_local;
  stbi__png *p_local;
  
  iVar1 = stbi__parse_png_file(p,2,0);
  if (iVar1 == 0) {
    stbi__rewind(p->s);
    p_local._4_4_ = 0;
  }
  else {
    if (x != (int *)0x0) {
      *x = p->s->img_x;
    }
    if (y != (int *)0x0) {
      *y = p->s->img_y;
    }
    if (comp != (int *)0x0) {
      *comp = p->s->img_n;
    }
    p_local._4_4_ = 1;
  }
  return p_local._4_4_;
}

Assistant:

static int stbi__png_info_raw(stbi__png *p, int *x, int *y, int *comp)
{
   if (!stbi__parse_png_file(p, STBI__SCAN_header, 0)) {
      stbi__rewind( p->s );
      return 0;
   }
   if (x) *x = p->s->img_x;
   if (y) *y = p->s->img_y;
   if (comp) *comp = p->s->img_n;
   return 1;
}